

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
ans_load_interp(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
               uint8_t *in_u8)

{
  byte bVar1;
  uint uVar2;
  uint32_t *out_buf;
  uint *puVar3;
  uint32_t uVar4;
  size_t n;
  ulong uVar5;
  uint uVar6;
  uint32_t *f;
  allocator_type local_29;
  byte *local_28;
  
  local_28 = in_u8;
  uVar4 = vbyte_decode_u32(&local_28);
  bVar1 = *local_28;
  f = (uint32_t *)(local_28 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)(uVar4 + 1),&local_29);
  out_buf = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_start;
  n = (long)(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)out_buf >> 2;
  interpolative_internal::decode(f,out_buf,n,(1L << ((ulong)bVar1 & 0x3f)) + 1 + n);
  puVar3 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *puVar3;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = puVar3[uVar5 + 1];
    puVar3[uVar5 + 1] = ~uVar6 + uVar2;
    uVar6 = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> ans_load_interp(const uint8_t* in_u8)
{
    uint32_t max_sym = vbyte_decode_u32(in_u8);
    uint32_t frame_size = (1 << (*in_u8++));
    auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
    std::vector<uint32_t> vec(max_sym + 1);
    interpolative_internal::decode(
        in_ptr_u32, vec.data(), vec.size(), frame_size + vec.size() + 1);
    uint32_t prev = vec[0];
    uint32_t max_norm_freq = 0;
    for (size_t sym = 1; sym <= max_sym; sym++) {
        auto cur = vec[sym];
        vec[sym] = cur - prev - 1;
        max_norm_freq = std::max(max_norm_freq, vec[sym]);
        prev = cur;
    }
    return vec;
}